

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rankStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  long *plVar1;
  CallCount *p;
  sqlite3_context *in_stack_ffffffffffffffd8;
  
  plVar1 = (long *)sqlite3_aggregate_context(in_stack_ffffffffffffffd8,0);
  if ((plVar1 != (long *)0x0) && (plVar1[1] = plVar1[1] + 1, *plVar1 == 0)) {
    *plVar1 = plVar1[1];
  }
  return;
}

Assistant:

static void rankStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nStep++;
    if( p->nValue==0 ){
      p->nValue = p->nStep;
    }
  }
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
}